

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if.h
# Opt level: O0

uint * If_CutTruth(If_Man_t *p,If_Cut_t *pCut)

{
  word *pwVar1;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  pwVar1 = If_CutTruthW(p,pCut);
  return (uint *)pwVar1;
}

Assistant:

static inline unsigned * If_CutTruth( If_Man_t * p, If_Cut_t * pCut )        { return (unsigned *)If_CutTruthW(p, pCut);                         }